

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::AMFImporter::Find_ConvertedMaterial
          (AMFImporter *this,string *pID,SPP_Material **pConvertedMaterial)

{
  bool bVar1;
  __type _Var2;
  reference __lhs;
  SPP_Material *mat;
  const_iterator __end1;
  const_iterator __begin1;
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  *__range1;
  SPP_Material **pConvertedMaterial_local;
  string *pID_local;
  AMFImporter *this_local;
  
  __end1 = std::__cxx11::
           list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
           ::begin(&this->mMaterial_Converted);
  mat = (SPP_Material *)
        std::__cxx11::
        list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
        ::end(&this->mMaterial_Converted);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&mat);
    if (!bVar1) {
      return false;
    }
    __lhs = std::_List_const_iterator<Assimp::AMFImporter::SPP_Material>::operator*(&__end1);
    _Var2 = std::operator==(&__lhs->ID,pID);
    if (_Var2) break;
    std::_List_const_iterator<Assimp::AMFImporter::SPP_Material>::operator++(&__end1);
  }
  if (pConvertedMaterial != (SPP_Material **)0x0) {
    *pConvertedMaterial = __lhs;
  }
  return true;
}

Assistant:

bool AMFImporter::Find_ConvertedMaterial(const std::string& pID, const SPP_Material** pConvertedMaterial) const
{
	for(const SPP_Material& mat: mMaterial_Converted)
	{
		if(mat.ID == pID)
		{
			if(pConvertedMaterial != nullptr) *pConvertedMaterial = &mat;

			return true;
		}
	}// for(const SPP_Material& mat: mMaterial_Converted)

	return false;
}